

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_RemoveWindowMapping(Uint32 windowID)

{
  ulong uVar1;
  ulong uVar2;
  GPU_WindowMapping *__dest;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  if (windowID != 0) {
    uVar1 = 0;
    uVar2 = 0;
    __dest = _gpu_window_mappings;
    if (0 < _gpu_num_window_mappings) {
      uVar2 = (ulong)(uint)_gpu_num_window_mappings;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      if (__dest->windowID == windowID) {
        __dest->target->context->windowID = 0;
        _gpu_num_window_mappings = _gpu_num_window_mappings - 1;
        if ((int)((uint)_gpu_num_window_mappings - uVar1) < 1) {
          return;
        }
        memmove(__dest,__dest + 1,((uint)_gpu_num_window_mappings - uVar1 & 0xffffffff) << 4);
        return;
      }
      __dest = __dest + 1;
    }
  }
  return;
}

Assistant:

void GPU_RemoveWindowMapping(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; i++)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
        {
            int num_to_move;

            // Unset the target's window
            _gpu_window_mappings[i].target->context->windowID = 0;

            // Move the remaining entries to replace the removed one
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}